

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O1

pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
cmExportBuildFileGenerator::FindBuildExportInfo
          (pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,cmExportBuildFileGenerator *this,cmGlobalGenerator *gg,
          string *name)

{
  pointer pTVar1;
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  __normal_iterator<cmExportBuildFileGenerator::TargetExport_*,_std::vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>_>
  __it;
  long lVar5;
  __normal_iterator<cmExportBuildFileGenerator::TargetExport_*,_std::vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>_>
  __it_00;
  __normal_iterator<cmExportBuildFileGenerator::TargetExport_*,_std::vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>_>
  __it_01;
  vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  targets;
  string ns;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exportFiles;
  vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  local_c8;
  string *local_a8 [2];
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  _Rb_tree_node_base *local_40;
  string *local_38;
  
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_allocated_capacity = (size_type)&local_78;
  local_88._8_8_ = 0;
  local_78._M_local_buf[0] = '\0';
  p_Var4 = (gg->BuildExportSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40 = &(gg->BuildExportSets)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_48 = __return_storage_ptr__;
  local_38 = name;
  if (p_Var4 != local_40) {
    do {
      local_c8.
      super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
      ._M_impl.super__Vector_impl_data._M_start = (TargetExport *)0x0;
      local_c8.
      super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
      ._M_impl.super__Vector_impl_data._M_finish = (TargetExport *)0x0;
      local_c8.
      super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      GetTargets(*(cmExportBuildFileGenerator **)(p_Var4 + 2),&local_c8);
      pTVar1 = local_c8.
               super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_a8[0] = local_38;
      lVar5 = (long)local_c8.
                    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_c8.
                    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 8;
      __it_01._M_current =
           local_c8.
           super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
           ._M_impl.super__Vector_impl_data._M_start;
      if (0 < lVar5) {
        __it_01._M_current =
             (TargetExport *)
             ((long)&((local_c8.
                       super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                       ._M_impl.super__Vector_impl_data._M_start)->Name)._M_dataplus._M_p +
             ((long)local_c8.
                    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_c8.
                    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                    ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00U));
        lVar5 = lVar5 + 1;
        __it_00._M_current =
             local_c8.
             super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
             ._M_impl.super__Vector_impl_data._M_start;
        do {
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::__0>
                                *)local_a8,__it_00);
          __it._M_current = __it_00._M_current;
          if (bVar3) goto LAB_0058a31c;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::__0>
                                *)local_a8,__it_00._M_current + 1);
          __it._M_current = __it_00._M_current + 1;
          if (bVar3) goto LAB_0058a31c;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::__0>
                                *)local_a8,__it_00._M_current + 2);
          __it._M_current = __it_00._M_current + 2;
          if (bVar3) goto LAB_0058a31c;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::__0>
                                *)local_a8,__it_00._M_current + 3);
          __it._M_current = __it_00._M_current + 3;
          if (bVar3) goto LAB_0058a31c;
          __it_00._M_current = __it_00._M_current + 4;
          lVar5 = lVar5 + -1;
        } while (1 < lVar5);
      }
      lVar5 = (long)pTVar1 - (long)__it_01._M_current >> 6;
      if (lVar5 == 1) {
LAB_0058a303:
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::$_0>
                ::operator()((_Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::__0>
                              *)local_a8,__it_01);
        __it._M_current = __it_01._M_current;
        if (!bVar3) {
          __it._M_current = pTVar1;
        }
      }
      else {
        __it._M_current = __it_01._M_current;
        if (lVar5 == 2) {
LAB_0058a2d7:
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::__0>
                                *)local_a8,__it);
          if (!bVar3) {
            __it_01._M_current = __it._M_current + 1;
            goto LAB_0058a303;
          }
        }
        else {
          __it._M_current = pTVar1;
          if ((lVar5 == 3) &&
             (bVar3 = __gnu_cxx::__ops::
                      _Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::$_0>
                      ::operator()((_Iter_pred<cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator*,std::__cxx11::string_const&)::__0>
                                    *)local_a8,__it_01), __it._M_current = __it_01._M_current,
             !bVar3)) {
            __it._M_current = __it_01._M_current + 1;
            goto LAB_0058a2d7;
          }
        }
      }
LAB_0058a31c:
      if (__it._M_current != pTVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_68,(value_type *)(p_Var4 + 1));
        lVar5 = *(long *)(*(long *)(p_Var4 + 2) + 8);
        local_a8[0] = (string *)local_98;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a8,lVar5,*(long *)(*(long *)(p_Var4 + 2) + 0x10) + lVar5);
        std::__cxx11::string::operator=((string *)(local_98 + 0x10),(string *)local_a8);
        if (local_a8[0] != (string *)local_98) {
          operator_delete(local_a8[0],(ulong)(local_98._0_8_ + 1));
        }
      }
      std::
      vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
      ::~vector(&local_c8);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != local_40);
  }
  ppVar2 = local_48;
  std::
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (local_48,&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10))
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_allocated_capacity != &local_78) {
    operator_delete((void *)local_88._M_allocated_capacity,
                    CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return ppVar2;
}

Assistant:

std::pair<std::vector<std::string>, std::string>
cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator* gg,
                                                const std::string& name)
{
  std::vector<std::string> exportFiles;
  std::string ns;

  auto& exportSets = gg->GetBuildExportSets();

  for (auto const& exp : exportSets) {
    const auto& exportSet = exp.second;
    std::vector<TargetExport> targets;
    exportSet->GetTargets(targets);
    if (std::any_of(
          targets.begin(), targets.end(),
          [&name](const TargetExport& te) { return te.Name == name; })) {
      exportFiles.push_back(exp.first);
      ns = exportSet->GetNamespace();
    }
  }

  return { exportFiles, ns };
}